

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_emptyTreeSeek_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_emptyTreeSeek_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  bool match_1;
  iterator e_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool match;
  iterator e;
  TypeParam *db;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  string local_968 [7];
  bool in_stack_fffffffffffff69f;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff6a0;
  AssertHelper local_948;
  Message local_940;
  bool local_931;
  AssertionResult local_930;
  string local_920;
  AssertHelper local_900;
  Message local_8f8;
  bool local_8e9;
  AssertionResult local_8e8;
  key_type local_8d8;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_8c8;
  bool local_8b1;
  iterator local_8b0;
  string local_740;
  AssertHelper local_720;
  Message local_718;
  bool local_709;
  AssertionResult local_708;
  string local_6f8;
  AssertHelper local_6d8;
  Message local_6d0;
  bool local_6c1;
  AssertionResult local_6c0 [2];
  key_type local_6a0;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_690;
  bool local_679;
  iterator local_678;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_508;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffff6a0,in_stack_fffffffffffff69f);
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator(&local_678,local_508);
  local_679 = false;
  local_6a0 = unodb::test::
              tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::coerce_key<int>(&local_500,0);
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_690.key,
             local_6a0);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek(&local_678,(art_key_type)local_690,&local_679,true);
  local_6c1 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_678);
  local_6c1 = !local_6c1;
  testing::AssertionResult::AssertionResult<bool>(local_6c0,&local_6c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6f8,(internal *)local_6c0,(AssertionResult *)"e.valid()","true","false",in_R9)
    ;
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_6f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult(local_6c0);
  local_709 = (bool)(~local_679 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_708,&local_709,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_708);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_740,(internal *)&local_708,(AssertionResult *)0x30452b,"true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_740);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    std::__cxx11::string::~string((string *)&local_740);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult(&local_708);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator(&local_678);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator(&local_8b0,local_508);
  local_8b1 = false;
  local_8d8 = unodb::test::
              tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::coerce_key<int>(&local_500,0);
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_8c8.key,
             local_8d8);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek(&local_8b0,(art_key_type)local_8c8,&local_8b1,false);
  local_8e9 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_8b0);
  local_8e9 = !local_8e9;
  testing::AssertionResult::AssertionResult<bool>(&local_8e8,&local_8e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_920,(internal *)&local_8e8,(AssertionResult *)"e.valid()","true","false",in_R9
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_920);
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    std::__cxx11::string::~string((string *)&local_920);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult(&local_8e8);
  local_931 = (bool)(~local_8b1 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_930,&local_931,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_930);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_968,(internal *)&local_930,(AssertionResult *)0x30452b,"true","false"
               ,in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_968);
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    std::__cxx11::string::~string(local_968);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult(&local_930);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator(&local_8b0);
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}